

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

ssize_t __thiscall serial::Serial::write(Serial *this,int __fd,void *__buf,size_t __n)

{
  uint8_t *data;
  size_t sVar1;
  undefined4 in_register_00000034;
  ScopedWriteLock lock;
  ScopedWriteLock local_18;
  
  local_18.pimpl_ = this->pimpl_;
  SerialImpl::writeLock(local_18.pimpl_);
  data = *(uint8_t **)CONCAT44(in_register_00000034,__fd);
  sVar1 = write_(this,data,((undefined8 *)CONCAT44(in_register_00000034,__fd))[1] - (long)data);
  ScopedWriteLock::~ScopedWriteLock(&local_18);
  return sVar1;
}

Assistant:

size_t
Serial::write (const std::vector<uint8_t> &data)
{
  ScopedWriteLock lock(this->pimpl_);
  return this->write_ (&data[0], data.size());
}